

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O2

void rev_ffd(kcc_joint *joint,mc_abi *m,joint_torque *tau,mc_wrench *f,int count)

{
  double dVar1;
  double dVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double *pdVar7;
  long lVar8;
  double dVar9;
  
  if (joint == (kcc_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x147,
                  "void rev_ffd(const struct kcc_joint *, const struct mc_abi *, const joint_torque *, struct mc_wrench *, int)"
                 );
  }
  if (m == (mc_abi *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x148,
                  "void rev_ffd(const struct kcc_joint *, const struct mc_abi *, const joint_torque *, struct mc_wrench *, int)"
                 );
  }
  if (tau == (joint_torque *)0x0) {
    __assert_fail("tau",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x149,
                  "void rev_ffd(const struct kcc_joint *, const struct mc_abi *, const joint_torque *, struct mc_wrench *, int)"
                 );
  }
  if (f != (mc_wrench *)0x0) {
    lVar3 = (long)(int)(joint->field_1).revolute_joint.axis;
    dVar1 = *(double *)((long)&(m->second_moment_of_mass).field_0 + lVar3 * 0x20);
    dVar2 = *(joint->field_1).revolute_joint.inertia;
    uVar4 = 0;
    uVar5 = (ulong)(uint)count;
    if (count < 1) {
      uVar5 = uVar4;
    }
    for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      dVar9 = tau[uVar6] / (dVar1 + dVar2);
      pdVar7 = (double *)((long)&(m->second_moment_of_mass).field_0 + lVar3 * 8);
      for (lVar8 = 0; lVar8 != 0x18; lVar8 = lVar8 + 8) {
        *(double *)((long)&f->torque->field_0 + lVar8 + uVar4) = *pdVar7 * dVar9;
        *(double *)((long)&f->force->field_0 + lVar8 + uVar4) =
             *(double *)((long)&(m->first_moment_of_mass).field_0 + lVar8 + lVar3 * 0x18) * dVar9;
        pdVar7 = pdVar7 + 3;
      }
      uVar4 = uVar4 + 0x18;
    }
    return;
  }
  __assert_fail("f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,0x14a,
                "void rev_ffd(const struct kcc_joint *, const struct mc_abi *, const joint_torque *, struct mc_wrench *, int)"
               );
}

Assistant:

static void rev_ffd(
        const struct kcc_joint *joint,
        const struct mc_abi *m,
        const joint_torque *tau,
        struct mc_wrench *f,
        int count)
{
    assert(joint);
    assert(m);
    assert(tau);
    assert(f);

    int k = joint->revolute_joint.axis;
    double d = m->second_moment_of_mass.row[k].data[k]
            + joint->revolute_joint.inertia[0];

    for (int i = 0; i < count; i++) {
        double qdd = tau[i] / d;
        for (int j = 0; j < 3; j++) {
            f->torque[i].data[j] = m->second_moment_of_mass.row[j].data[k] * qdd;
            f->force[i].data[j] = m->first_moment_of_mass.row[k].data[j] * qdd;    // consider transpose, thus [k, j]
        }
    }
}